

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O0

void __thiscall CGraphics_Threaded::Shutdown(CGraphics_Threaded *this)

{
  long *plVar1;
  void *pvVar2;
  CCommandBuffer *in_RDI;
  int i;
  int local_c;
  
  (**(code **)(*(long *)in_RDI[2].m_CmdBuffer.m_pData + 0x18))();
  plVar1 = (long *)in_RDI[2].m_CmdBuffer.m_pData;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  in_RDI[2].m_CmdBuffer.m_pData = (uchar *)0x0;
  for (local_c = 0; local_c < 2; local_c = local_c + 1) {
    pvVar2 = *(void **)(&in_RDI[2].m_CmdBuffer.m_Size + (long)local_c * 2);
    if (pvVar2 != (void *)0x0) {
      CCommandBuffer::~CCommandBuffer(in_RDI);
      operator_delete(pvVar2,0x30);
    }
  }
  return;
}

Assistant:

void CGraphics_Threaded::Shutdown()
{
	// shutdown the backend
	m_pBackend->Shutdown();
	delete m_pBackend;
	m_pBackend = 0x0;

	// delete the command buffers
	for(int i = 0; i < NUM_CMDBUFFERS; i++)
		delete m_apCommandBuffers[i];
}